

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  xmlURIPtr uri;
  xmlNodePtr pxVar9;
  xmlNs *pxVar10;
  _xmlNode *p_Var11;
  long lVar12;
  char *pcVar13;
  xmlC14NVisibleNsStackPtr p_Var14;
  xmlOutputBufferPtr out;
  char *node_type;
  int iVar15;
  undefined1 *ns;
  undefined8 in_stack_ffffffffffffff78;
  xmlListPtr local_58;
  undefined8 local_48;
  
  pcVar13 = (char *)cur;
  if (cur == (xmlNodePtr)0x0) {
    return 0;
  }
  do {
    iVar4 = 1;
    if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
      pcVar13 = (char *)cur;
      iVar4 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
    }
    iVar15 = 0;
    iVar5 = 0;
    switch(cur->type) {
    case XML_ELEMENT_NODE:
      for (pxVar10 = cur->nsDef; pxVar10 != (xmlNs *)0x0; pxVar10 = pxVar10->next) {
        iVar5 = xmlStrlen(pxVar10->href);
        if (0 < iVar5) {
          uri = xmlParseURI((char *)pxVar10->href);
          if (uri == (xmlURIPtr)0x0) {
            xmlC14NErrInternal("parsing namespace uri");
          }
          else {
            iVar5 = xmlStrlen((xmlChar *)uri->scheme);
            if (iVar5 != 0) {
              xmlFreeURI(uri);
              goto LAB_00137773;
            }
            __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                            (void *)0x0,(void *)0x0,0x15,0x7a3,XML_ERR_ERROR,(char *)0x0,0,
                            (char *)0x0,(char *)0x0,(char *)0x0,0,0,
                            "Relative namespace UR is invalid here : %s\n",uri->scheme);
            xmlFreeURI(uri);
          }
          pcVar13 = "checking for relative namespaces";
          goto LAB_00137ef9;
        }
LAB_00137773:
      }
      p_Var14 = ctx->ns_rendered;
      if (p_Var14 == (xmlC14NVisibleNsStackPtr)0x0) {
        xmlC14NErrParam("saving namespaces stack");
        local_48 = 0;
        iVar5 = 0;
      }
      else {
        local_48._0_4_ = p_Var14->nsCurEnd;
        local_48._4_4_ = p_Var14->nsPrevStart;
        iVar5 = p_Var14->nsPrevEnd;
      }
      if (iVar4 == 0) {
        iVar15 = 0;
      }
      else {
        iVar15 = ctx->parent_is_doc;
        if (iVar15 != 0) {
          ctx->pos = XMLC14N_INSIDE_DOCUMENT_ELEMENT;
          ctx->parent_is_doc = 0;
        }
        xmlOutputBufferWriteString(ctx->buf,"<");
        if ((cur->ns != (xmlNs *)0x0) && (iVar6 = xmlStrlen(cur->ns->prefix), 0 < iVar6)) {
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
          xmlOutputBufferWriteString(ctx->buf,":");
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
      }
      if (ctx->mode != XML_C14N_EXCLUSIVE_1_0) {
        if (cur->type == XML_ELEMENT_NODE) {
          local_58 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
          if (local_58 != (xmlListPtr)0x0) {
            bVar1 = false;
            p_Var11 = cur;
            do {
              for (pxVar7 = (xmlNodePtr)p_Var11->nsDef; pxVar7 != (xmlNodePtr)0x0;
                  pxVar7 = (xmlNodePtr)pxVar7->_private) {
                pxVar9 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)pxVar7->children);
                if (((pxVar9 == pxVar7) && (iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar7), iVar6 == 0))
                   && ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                       (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar6 != 0))
                      )) {
                  iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar7);
                  if (iVar4 != 0) {
                    xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar7,cur);
                  }
                  if (iVar6 == 0) {
                    xmlListInsert(local_58,pxVar7);
                  }
                  iVar6 = xmlStrlen((xmlChar *)pxVar7->children);
                  if (iVar6 == 0) {
                    bVar1 = true;
                  }
                }
              }
              p_Var11 = p_Var11->parent;
            } while (p_Var11 != (_xmlNode *)0x0);
            if ((iVar4 != 0) && (!bVar1)) {
              xmlC14NProcessNamespacesAxis_ns_default._32_8_ = 0;
              xmlC14NProcessNamespacesAxis_ns_default._40_8_ = 0;
              xmlC14NProcessNamespacesAxis_ns_default._16_8_ = 0;
              xmlC14NProcessNamespacesAxis_ns_default._24_8_ = 0;
              xmlC14NProcessNamespacesAxis_ns_default._0_8_ = 0;
              xmlC14NProcessNamespacesAxis_ns_default._8_8_ = 0;
              p_Var14 = ctx->ns_rendered;
              ns = xmlC14NProcessNamespacesAxis_ns_default;
              goto LAB_00137cba;
            }
            goto LAB_00137d25;
          }
          pcVar13 = "creating namespaces list (c14n)";
LAB_00137feb:
          xmlC14NErrInternal(pcVar13);
        }
        else {
          pcVar13 = "processing namespaces axis (c14n)";
LAB_00137fd4:
          xmlC14NErrParam(pcVar13);
        }
        pcVar13 = "processing namespaces axis";
        goto LAB_00137ef9;
      }
      if (cur->type != XML_ELEMENT_NODE) {
        pcVar13 = "processing namespaces axis (exc c14n)";
        goto LAB_00137fd4;
      }
      local_58 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
      if (local_58 == (xmlListPtr)0x0) {
        pcVar13 = "creating namespaces list (exc c14n)";
        goto LAB_00137feb;
      }
      bVar1 = false;
      if ((ctx->inclusive_ns_prefixes == (xmlChar **)0x0) ||
         (pxVar8 = *ctx->inclusive_ns_prefixes, pxVar8 == (xmlChar *)0x0)) {
        bVar2 = false;
        bVar3 = false;
      }
      else {
        bVar3 = false;
        lVar12 = 8;
        bVar2 = false;
        do {
          iVar6 = xmlStrEqual(pxVar8,(xmlChar *)"#default");
          if ((iVar6 != 0) || (iVar6 = xmlStrEqual(pxVar8,""), iVar6 != 0)) {
            bVar3 = true;
            pxVar8 = (xmlChar *)0x0;
          }
          pxVar7 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,pxVar8);
          if (((pxVar7 != (xmlNodePtr)0x0) && (iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar7), iVar6 == 0)
              ) && ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                    (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar6 != 0))))
          {
            iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar7);
            if (iVar4 != 0) {
              xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar7,cur);
            }
            if (iVar6 == 0) {
              xmlListInsert(local_58,pxVar7);
            }
            iVar6 = xmlStrlen((xmlChar *)pxVar7->children);
            if (iVar6 == 0) {
              bVar2 = true;
            }
          }
          pxVar8 = *(xmlChar **)((long)ctx->inclusive_ns_prefixes + lVar12);
          lVar12 = lVar12 + 8;
        } while (pxVar8 != (xmlChar *)0x0);
      }
      pxVar7 = (xmlNodePtr)cur->ns;
      if (pxVar7 == (xmlNodePtr)0x0) {
        pxVar7 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
        bVar1 = true;
        if (pxVar7 != (xmlNodePtr)0x0) goto LAB_00137b03;
      }
      else {
LAB_00137b03:
        iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar7);
        if (iVar6 == 0) {
          if (iVar4 != 0) {
            if (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar6 != 0)) &&
               (iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar7,ctx),
               iVar6 == 0)) {
              xmlListInsert(local_58,pxVar7);
            }
            xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar7,cur);
          }
          iVar6 = xmlStrlen((xmlChar *)pxVar7->children);
          if (iVar6 == 0) {
            bVar2 = true;
          }
        }
      }
      for (pxVar7 = (xmlNodePtr)cur->properties; pxVar7 != (xmlNodePtr)0x0; pxVar7 = pxVar7->next) {
        if (pxVar7->ns != (xmlNsPtr)0x0) {
          iVar6 = xmlC14NIsXmlNs(pxVar7->ns);
          if ((iVar6 == 0) &&
             ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
              (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar7,cur), iVar6 != 0)))) {
            iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,pxVar7->ns,ctx);
            xmlC14NVisibleNsStackAdd(ctx->ns_rendered,pxVar7->ns,cur);
            if ((iVar4 != 0) && (iVar6 == 0)) {
              xmlListInsert(local_58,pxVar7->ns);
            }
            iVar6 = xmlStrlen(pxVar7->ns->prefix);
            if (iVar6 == 0) {
              bVar2 = true;
            }
          }
          else if ((pxVar7->ns != (xmlNs *)0x0) &&
                  ((iVar6 = xmlStrlen(pxVar7->ns->prefix), iVar6 == 0 &&
                   (iVar6 = xmlStrlen(pxVar7->ns->href), iVar6 == 0)))) {
            bVar1 = true;
          }
        }
      }
      if ((!bVar2 && !bVar3) && (bVar1 && iVar4 != 0)) {
        xmlExcC14NProcessNamespacesAxis_ns_default._32_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default._40_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default._16_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default._24_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default._0_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default._8_8_ = 0;
        ns = xmlExcC14NProcessNamespacesAxis_ns_default;
        iVar6 = xmlExcC14NVisibleNsStackFind
                          (ctx->ns_rendered,(xmlNsPtr)xmlExcC14NProcessNamespacesAxis_ns_default,ctx
                          );
      }
      else {
        if (!(bool)((iVar4 != 0 && !bVar2) & bVar3)) goto LAB_00137d25;
        xmlExcC14NProcessNamespacesAxis_ns_default_66._32_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default_66._40_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default_66._16_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default_66._24_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default_66._0_8_ = 0;
        xmlExcC14NProcessNamespacesAxis_ns_default_66._8_8_ = 0;
        p_Var14 = ctx->ns_rendered;
        ns = xmlExcC14NProcessNamespacesAxis_ns_default_66;
LAB_00137cba:
        iVar6 = xmlC14NVisibleNsStackFind(p_Var14,(xmlNsPtr)ns);
      }
      if (iVar6 == 0) {
        xmlC14NPrintNamespaces((xmlNsPtr)ns,ctx);
      }
LAB_00137d25:
      xmlListWalk(local_58,xmlC14NPrintNamespacesWalker,ctx);
      xmlListDelete(local_58);
      if (iVar4 == 0) {
        iVar6 = xmlC14NProcessAttrsAxis(ctx,cur,0);
        if (iVar6 < 0) goto LAB_00137fac;
      }
      else {
        p_Var14 = ctx->ns_rendered;
        if (p_Var14 == (xmlC14NVisibleNsStackPtr)0x0) {
          xmlC14NErrParam("shifting namespaces stack");
        }
        else {
          p_Var14->nsPrevStart = p_Var14->nsPrevEnd;
          p_Var14->nsPrevEnd = p_Var14->nsCurEnd;
        }
        iVar6 = xmlC14NProcessAttrsAxis(ctx,cur,iVar4);
        if (iVar6 < 0) {
LAB_00137fac:
          pcVar13 = "processing attributes axis";
          goto LAB_00137ef9;
        }
        xmlOutputBufferWriteString(ctx->buf,">");
      }
      pcVar13 = (char *)cur->children;
      if (((xmlNodePtr)pcVar13 != (xmlNodePtr)0x0) &&
         (iVar6 = xmlC14NProcessNodeList(ctx,(xmlNodePtr)pcVar13), iVar6 < 0)) {
        pcVar13 = "processing childrens list";
LAB_00137ef9:
        xmlC14NErrInternal(pcVar13);
        return -1;
      }
      if (iVar4 != 0) {
        xmlOutputBufferWriteString(ctx->buf,"</");
        if ((cur->ns != (xmlNs *)0x0) && (iVar4 = xmlStrlen(cur->ns->prefix), 0 < iVar4)) {
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
          xmlOutputBufferWriteString(ctx->buf,":");
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
        pcVar13 = ">";
        xmlOutputBufferWriteString(ctx->buf,">");
        if (iVar15 != 0) {
          ctx->parent_is_doc = iVar15;
          ctx->pos = XMLC14N_AFTER_DOCUMENT_ELEMENT;
        }
      }
      p_Var14 = ctx->ns_rendered;
      if (p_Var14 == (xmlC14NVisibleNsStackPtr)0x0) {
        xmlC14NErrParam("restoring namespaces stack");
      }
      else {
        p_Var14->nsCurEnd = (int)local_48;
        p_Var14->nsPrevStart = local_48._4_4_;
        p_Var14->nsPrevEnd = iVar5;
      }
      iVar5 = 0;
      break;
    case XML_ATTRIBUTE_NODE:
      node_type = "XML_ATTRIBUTE_NODE";
      goto LAB_00137f22;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
      iVar5 = iVar15;
      if ((iVar4 != 0) && (cur->content != (xmlChar *)0x0)) {
        pcVar13 = &DAT_00000003;
        pxVar7 = (xmlNodePtr)xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_TEXT);
        if (pxVar7 == (xmlNodePtr)0x0) {
          xmlC14NErrInternal("normalizing text node");
        }
        else {
          pcVar13 = (char *)pxVar7;
          xmlOutputBufferWriteString(ctx->buf,(char *)pxVar7);
          (*xmlFree)(pxVar7);
        }
        iVar5 = -(uint)(pxVar7 == (xmlNodePtr)0x0);
      }
      break;
    case XML_ENTITY_REF_NODE:
      node_type = "XML_ENTITY_REF_NODE";
      goto LAB_00137f22;
    case XML_ENTITY_NODE:
      node_type = "XML_ENTITY_NODE";
      goto LAB_00137f22;
    case XML_PI_NODE:
      iVar5 = iVar15;
      if (iVar4 != 0) {
        pcVar13 = "<?";
        if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
          pcVar13 = "\n<?";
        }
        xmlOutputBufferWriteString(ctx->buf,pcVar13);
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
        if ((cur->content != (xmlChar *)0x0) && (*cur->content != '\0')) {
          xmlOutputBufferWriteString(ctx->buf," ");
          pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_PI);
          if (pxVar8 == (xmlChar *)0x0) {
            pcVar13 = "normalizing pi node";
            goto LAB_00137ef9;
          }
          xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
          (*xmlFree)(pxVar8);
        }
        out = ctx->buf;
        if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
          pcVar13 = "?>\n";
        }
        else {
          pcVar13 = "?>";
        }
LAB_00137d0f:
        xmlOutputBufferWriteString(out,pcVar13);
        iVar5 = iVar15;
      }
      break;
    case XML_COMMENT_NODE:
      iVar5 = iVar15;
      if ((iVar4 != 0) && (ctx->with_comments != 0)) {
        pcVar13 = "<!--";
        if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
          pcVar13 = "\n<!--";
        }
        xmlOutputBufferWriteString(ctx->buf,pcVar13);
        if (cur->content != (xmlChar *)0x0) {
          pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_COMMENT);
          if (pxVar8 == (xmlChar *)0x0) {
            pcVar13 = "normalizing comment node";
            goto LAB_00137ef9;
          }
          xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
          (*xmlFree)(pxVar8);
        }
        out = ctx->buf;
        if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
          pcVar13 = "-->\n";
        }
        else {
          pcVar13 = "-->";
        }
        goto LAB_00137d0f;
      }
      break;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_FRAG_NODE:
    case XML_HTML_DOCUMENT_NODE:
      pcVar13 = (char *)cur->children;
      if ((xmlNodePtr)pcVar13 != (xmlNodePtr)0x0) {
        ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
        ctx->parent_is_doc = 1;
        iVar5 = xmlC14NProcessNodeList(ctx,(xmlNodePtr)pcVar13);
      }
      break;
    case XML_DOCUMENT_TYPE_NODE:
    case XML_NOTATION_NODE:
    case XML_DTD_NODE:
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      break;
    case XML_NAMESPACE_DECL:
      node_type = "XML_NAMESPACE_DECL";
LAB_00137f22:
      xmlC14NErrInvalidNode(node_type,pcVar13);
      return -1;
    default:
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x15,0x7a2,XML_ERR_ERROR,(char *)0x0,0,"processing node",
                      (char *)0x0,(char *)0x0,0,0,"Unknown node type %d found : %s\n",
                      CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),cur->type),
                      "processing node");
      return -1;
    }
    cur = cur->next;
    if (cur == (_xmlNode *)0x0) {
      return iVar5;
    }
    if (iVar5 < 0) {
      return iVar5;
    }
  } while( true );
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam("processing node list");
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}